

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O0

int lrtr_ipv6_addr_to_str(lrtr_ipv6_addr *ip_addr,char *b,uint len)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  uint local_7c;
  uint32_t x_1;
  uint32_t x;
  int i;
  int curlen;
  int curpos;
  int bestlen;
  int bestpos;
  uint32_t *a;
  char *pcStack_40;
  uint len_local;
  char *b_local;
  lrtr_ipv6_addr *ip_addr_local;
  ushort auStack_28 [4];
  uint16_t words [8];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (len < 0x2e) {
    ip_addr_local._4_4_ = -1;
  }
  else {
    curpos = 0;
    curlen = 0;
    i = 0;
    x = 0;
    for (x_1 = 0; (int)x_1 < 8; x_1 = x_1 + 1) {
      local_7c = ip_addr->addr[(int)x_1 / 2];
      if ((int)x_1 % 2 == 0) {
        local_7c = local_7c >> 0x10;
      }
      auStack_28[(int)x_1] = (ushort)local_7c;
      if (auStack_28[(int)x_1] == 0) {
        if (x == 0) {
          i = x_1;
        }
        x = x + 1;
        if (curlen < (int)x) {
          curpos = i;
          curlen = x;
        }
      }
      else {
        x = 0;
      }
    }
    if (curlen < 2) {
      curpos = -1;
    }
    if ((curpos == 0) && (((curlen == 5 && (ip_addr->addr[2] == 0xffff)) || (curlen == 6)))) {
      uVar1 = ip_addr->addr[3];
      pcVar4 = "";
      if (ip_addr->addr[2] != 0) {
        pcVar4 = "ffff:";
      }
      sprintf(b,"::%s%d.%d.%d.%d",pcVar4,(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
              (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
      ip_addr_local._4_4_ = 0;
    }
    else {
      pcStack_40 = b;
      for (x_1 = 0; (int)x_1 < 8; x_1 = x_1 + 1) {
        if (x_1 == curpos) {
          x_1 = curlen + -1 + x_1;
          *pcStack_40 = ':';
          pcVar4 = pcStack_40 + 1;
          if (x_1 == 7) {
            pcStack_40[1] = ':';
            pcVar4 = pcStack_40 + 2;
          }
        }
        else {
          if (x_1 != 0) {
            *pcStack_40 = ':';
            pcStack_40 = pcStack_40 + 1;
          }
          iVar3 = sprintf(pcStack_40,"%x",(ulong)auStack_28[(int)x_1]);
          pcVar4 = pcStack_40 + iVar3;
        }
        pcStack_40 = pcVar4;
      }
      *pcStack_40 = '\0';
      ip_addr_local._4_4_ = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return ip_addr_local._4_4_;
}

Assistant:

int lrtr_ipv6_addr_to_str(const struct lrtr_ipv6_addr *ip_addr, char *b, const unsigned int len)
{
	if (len < INET6_ADDRSTRLEN)
		return -1;
	const uint32_t *a = ip_addr->addr;
	uint16_t words[8];
	int bestpos = 0;
	int bestlen = 0;
	int curpos = 0;
	int curlen = 0;
	int i;

	/* First of all, preprocess the address and find the longest run of zeros */
	for (i = 0; i < 8; i++) {
		uint32_t x = a[i / 2];

		words[i] = ((i % 2) ? x : (x >> 16)) & 0xffff;
		if (words[i]) {
			curlen = 0;
		} else {
			if (!curlen)
				curpos = i;
			curlen++;
			if (curlen > bestlen) {
				bestpos = curpos;
				bestlen = curlen;
			}
		}
	}
	if (bestlen < 2)
		bestpos = -1;

	/* Is it an encapsulated IPv4 address? */
	if (!bestpos && ((bestlen == 5 && a[2] == 0xffff) || bestlen == 6))
	// if (!bestpos && ((bestlen == 5 && (a[2] == 0xffff)) || bestlen == 6))
	{
		uint32_t x = a[3];

		b += sprintf(b, "::%s%d.%d.%d.%d", a[2] ? "ffff:" : "", ((x >> 24) & 0xff), ((x >> 16) & 0xff),
			     ((x >> 8) & 0xff), (x & 0xff));
		return 0;
	}

	/* Normal IPv6 formatting, compress the largest sequence of zeros */
	for (i = 0; i < 8; i++) {
		if (i == bestpos) {
			i += bestlen - 1;
			*b++ = ':';
			if (i == 7)
				*b++ = ':';
		} else {
			if (i)
				*b++ = ':';
			b += sprintf(b, "%x", words[i]);
		}
	}
	*b = '\0';
	return 0;
}